

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O3

void __thiscall ParserTestDyndepImplicitInput::Run(ParserTestDyndepImplicitInput *this)

{
  Edge *pEVar1;
  Test *this_00;
  bool bVar2;
  int iVar3;
  Node *pNVar4;
  StringPiece path;
  
  iVar3 = g_current_test->assertion_failures_;
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule cat\n  command = cat $in > $out\nbuild result: cat in | dd\n  dyndep = dd\n");
  if (iVar3 == g_current_test->assertion_failures_) {
    path.len_ = 6;
    path.str_ = "result";
    pNVar4 = State::GetNode(&(this->super_ParserTest).state,path,0);
    pEVar1 = pNVar4->in_edge_;
    bVar2 = testing::Test::Check
                      (g_current_test,pEVar1->dyndep_ != (Node *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                       ,0x46b,"edge->dyndep_");
    if (bVar2) {
      testing::Test::Check
                (g_current_test,pEVar1->dyndep_->dyndep_pending_,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x46c,"edge->dyndep_->dyndep_pending()");
      this_00 = g_current_test;
      iVar3 = std::__cxx11::string::compare((char *)pEVar1->dyndep_);
      testing::Test::Check
                (this_00,iVar3 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0x46d,"edge->dyndep_->path() == \"dd\"");
      return;
    }
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(ParserTest, DyndepImplicitInput) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n"
"  command = cat $in > $out\n"
"build result: cat in | dd\n"
"  dyndep = dd\n"));
  Edge* edge = state.GetNode("result", 0)->in_edge();
  ASSERT_TRUE(edge->dyndep_);
  EXPECT_TRUE(edge->dyndep_->dyndep_pending());
  EXPECT_EQ(edge->dyndep_->path(), "dd");
}